

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
* boost::unordered::detail::foa::
  table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
  ::new_(table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
         *__return_storage_ptr__,allocator_type al,size_t n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = n / 0xf;
  if (uVar2 == 0) {
    uVar1 = 0x40;
  }
  else {
    uVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = uVar1 ^ 0x3f;
  }
  uVar2 = 0x3f;
  if (0x1d < n) {
    uVar2 = uVar1;
  }
  __return_storage_ptr__->groups_size_index = uVar2;
  __return_storage_ptr__->groups_size_mask = ~(-1L << (-(char)uVar2 & 0x3fU));
  __return_storage_ptr__->groups_ = (group_type_pointer)0x0;
  __return_storage_ptr__->elements_ = (value_type_pointer)0x0;
  if (n == 0) {
    __return_storage_ptr__->groups_ =
         (group_type_pointer)
         &dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
          ::storage;
  }
  else {
    set_arrays(__return_storage_ptr__,al.storage,n);
  }
  return __return_storage_ptr__;
}

Assistant:

static table_arrays new_(allocator_type al, std::size_t n) {
        auto groups_size_index = size_index_for<group_type, size_policy>(n);
        auto groups_size = size_policy::size(groups_size_index);
        table_arrays arrays{groups_size_index, groups_size - 1, nullptr, nullptr};

        set_arrays(arrays, al, n);
        return arrays;
    }